

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.h
# Opt level: O1

void __thiscall Assimp::ASE::Mesh::Mesh(Mesh *this,string *name)

{
  uint c;
  long lVar1;
  
  (this->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
  super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
  super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
  super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BaseNode::BaseNode(&this->super_BaseNode,Mesh,name);
  lVar1 = 0;
  memset(this->amTexCoords,0,0xc0);
  (this->mVertexColors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mVertexColors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mVertexColors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mBoneVertices).
  super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mBoneVertices).
  super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mBoneVertices).
  super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mBones).super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mBones).super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mBones).super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->iMaterialIndex = 0xffffffff;
  this->bSkip = false;
  do {
    this->mNumUVComponents[lVar1] = 2;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  return;
}

Assistant:

explicit Mesh(const std::string &name)
    : BaseNode( BaseNode::Mesh, name )
    , mVertexColors()
    , mBoneVertices()
    , mBones()
    , iMaterialIndex(Face::DEFAULT_MATINDEX)
    , bSkip     (false) {
        for (unsigned int c = 0; c < AI_MAX_NUMBER_OF_TEXTURECOORDS;++c) {
            this->mNumUVComponents[c] = 2;
        }
    }